

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

void anm_extract(anm_archive_t *anm,char *name)

{
  list_node_t *plVar1;
  long *plVar2;
  uchar *__s;
  uchar *__ptr;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  image_t image;
  image_t local_48;
  
  local_48.width = 0;
  local_48.height = 0;
  local_48.format = 0xffffffff;
  util_total_entry_size(anm,name,&local_48.width,&local_48.height);
  if (local_48.height != 0 && local_48.width != 0) {
    iVar4 = local_48.width * 4;
    uVar8 = local_48.height * iVar4;
    __s = (uchar *)malloc((ulong)uVar8);
    local_48.data = __s;
    memset(__s,0xff,(ulong)uVar8);
    lVar6 = 0;
    do {
      for (plVar1 = (anm->entries).head; plVar1 != (list_node_t *)0x0; plVar1 = plVar1->next) {
        plVar2 = (long *)plVar1->data;
        if ((*(short *)(*plVar2 + 0x34) != 0) && ((char *)plVar2[2] == name)) {
          lVar5 = plVar2[1];
          if ((&DAT_0012f050)[lVar6] == (uint)*(ushort *)(lVar5 + 6)) {
            __ptr = format_to_rgba((uchar *)plVar2[8],
                                   (uint)*(ushort *)(lVar5 + 10) * (uint)*(ushort *)(lVar5 + 8),
                                   (&DAT_0012f050)[lVar6]);
            lVar5 = *plVar2;
            lVar3 = plVar2[1];
            uVar8 = *(uint *)(lVar5 + 0x24);
            uVar7 = (ulong)uVar8;
            if (uVar8 < *(ushort *)(lVar3 + 10) + uVar8) {
              iVar9 = uVar8 * 4;
              uVar8 = iVar4 * uVar8;
              uVar10 = uVar7;
              do {
                memcpy(__s + (ulong)(uint)(*(int *)(lVar5 + 0x20) << 2) + (ulong)uVar8,
                       __ptr + (iVar9 + (int)uVar7 * -4) * (uint)*(ushort *)(lVar3 + 8),
                       (ulong)*(ushort *)(lVar3 + 8) << 2);
                uVar10 = uVar10 + 1;
                lVar5 = *plVar2;
                lVar3 = plVar2[1];
                uVar7 = (ulong)*(uint *)(lVar5 + 0x24);
                iVar9 = iVar9 + 4;
                uVar8 = uVar8 + iVar4;
              } while (uVar10 < (uint)*(ushort *)(lVar3 + 10) + *(uint *)(lVar5 + 0x24));
            }
            free(__ptr);
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 5);
    util_makepath(name);
    png_write(name,&local_48);
    free(local_48.data);
  }
  return;
}

Assistant:

static void
anm_extract(
    const anm_archive_t* anm,
    const char* name)
{
    const format_t formats[] = {
        FORMAT_GRAY8,
        FORMAT_ARGB4444,
        FORMAT_RGB565,
        FORMAT_BGRA8888,
        FORMAT_RGBA8888
    };
    image_t image;

    unsigned int f, y;

    image.width = 0;
    image.height = 0;
    image.format = FORMAT_RGBA8888;

    util_total_entry_size(anm, name, &image.width, &image.height);

    if (image.width == 0 || image.height == 0) {
        /* Then there's nothing to extract. */
        return;
    }

    image.data = malloc(image.width * image.height * 4);
    /* XXX: Why 0xff? */
    memset(image.data, 0xff, image.width * image.height * 4);

    for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {
        anm_entry_t* entry;
        list_for_each(&anm->entries, entry) {
            if (entry->header->hasdata && entry->name == name && formats[f] == entry->thtx->format) {
                unsigned char* temp_data = format_to_rgba(entry->data, entry->thtx->w * entry->thtx->h, entry->thtx->format);
                for (y = entry->header->y; y < entry->header->y + entry->thtx->h; ++y) {
                    memcpy(image.data + y * image.width * 4 + entry->header->x * 4,
                           temp_data + (y - entry->header->y) * entry->thtx->w * 4,
                           entry->thtx->w * 4);
                }
                free(temp_data);
            }
        }
    }

    util_makepath(name);
    png_write(name, &image);

    free(image.data);
}